

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_starts_with(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                     lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_set *plVar1;
  char *__s;
  lyd_node *plVar2;
  int iVar3;
  size_t __n;
  lys_node *plVar4;
  char *pcVar5;
  long lVar6;
  uint32_t uVar7;
  uint uVar8;
  ly_ctx *plVar9;
  int iVar10;
  
  plVar1 = *args;
  if ((options & 0x1cU) == 0) {
    iVar3 = lyxp_set_cast(plVar1,LYXP_SET_STRING,cur_node,param_4,options);
    iVar10 = -1;
    if (iVar3 == 0) {
      iVar3 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      iVar10 = -1;
      if (iVar3 == 0) {
        pcVar5 = ((*args)->val).str;
        __s = (args[1]->val).str;
        __n = strlen(__s);
        iVar3 = strncmp(pcVar5,__s,__n);
        set_free_content(set);
        set->type = LYXP_SET_BOOLEAN;
        *(uint *)&set->val = (uint)(iVar3 == 0);
        iVar10 = 0;
      }
    }
  }
  else {
    iVar10 = 0;
    if (plVar1->type == LYXP_SET_SNODE_SET) {
      uVar7 = plVar1->used;
      do {
        uVar7 = uVar7 - 1;
        if ((plVar1->val).nodes[uVar7].pos == 1) {
          plVar2 = (plVar1->val).nodes[uVar7].node;
          if (plVar2 == (lyd_node *)0x0) break;
          if ((*(LYS_NODE *)&plVar2->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            plVar9 = param_4->ctx;
            plVar4 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar2->ht);
            pcVar5 = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            iVar3 = warn_is_string_type((lys_type *)&plVar2[1].ht);
            iVar10 = 0;
            if (iVar3 != 0) break;
            plVar9 = param_4->ctx;
            plVar4 = plVar2->schema;
            pcVar5 = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar9,LY_LLWRN,LY_SUCCESS,pcVar5,"xpath_starts_with",plVar4);
          iVar10 = 1;
          break;
        }
      } while (uVar7 != 0);
    }
    plVar1 = args[1];
    if (plVar1->type == LYXP_SET_SNODE_SET) {
      uVar8 = plVar1->used;
      do {
        uVar8 = uVar8 - 1;
        if ((plVar1->val).nodes[uVar8].pos == 1) {
          plVar2 = (plVar1->val).nodes[uVar8].node;
          if (plVar2 == (lyd_node *)0x0) break;
          if ((*(LYS_NODE *)&plVar2->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            plVar9 = param_4->ctx;
            plVar4 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar2->ht);
            pcVar5 = "Argument #2 of %s is a %s node \"%s\".";
          }
          else {
            iVar3 = warn_is_string_type((lys_type *)&plVar2[1].ht);
            if (iVar3 != 0) break;
            plVar9 = param_4->ctx;
            plVar4 = plVar2->schema;
            pcVar5 = "Argument #2 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar9,LY_LLWRN,LY_SUCCESS,pcVar5,"xpath_starts_with",plVar4);
          iVar10 = 1;
          break;
        }
      } while (uVar8 != 0);
    }
    uVar8 = set->used;
    if ((ulong)uVar8 != 0) {
      lVar6 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar6) == 1) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = 0;
        }
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar6);
    }
  }
  return iVar10;
}

Assistant:

static int
xpath_starts_with(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                  struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (strncmp(args[0]->val.str, args[1]->val.str, strlen(args[1]->val.str))) {
        set_fill_boolean(set, 0);
    } else {
        set_fill_boolean(set, 1);
    }

    return EXIT_SUCCESS;
}